

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmGraph.cpp
# Opt level: O1

void PrintInstruction(InstructionVMGraphContext *ctx,VmInstruction *instruction)

{
  byte *pbVar1;
  char *pcVar2;
  SynBase *pSVar3;
  TypeBase *pTVar4;
  VmValue **ppVVar5;
  VmValue *pVVar6;
  VmValue *value;
  VmInstruction *value_00;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  char *pcVar11;
  VmInstruction *instruction_00;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  char *pcVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  uint local_50;
  
  if (((ctx->showSource == true) &&
      (pSVar3 = (instruction->super_VmValue).source, pSVar3 != (SynBase *)0x0)) &&
     (pSVar3->isInternal == false)) {
    pcVar11 = (pSVar3->pos).begin;
    iVar7 = -(int)pcVar11;
    uVar12 = 0;
    lVar17 = 0;
    do {
      lVar10 = lVar17;
      uVar18 = (ulong)uVar12;
      pcVar2 = pcVar11 + lVar10;
      if ((pcVar2 <= ctx->code) || (pcVar11[lVar10 + -1] == '\r')) break;
      uVar12 = uVar12 + 1;
      lVar17 = lVar10 + -1;
    } while (pcVar11[lVar10 + -1] != '\n');
    uVar13 = -lVar10;
    pcVar15 = pcVar11;
    do {
      do {
        pbVar1 = (byte *)(pcVar15 + 1);
        pcVar15 = pcVar15 + 1;
      } while (0xd < *pbVar1);
    } while ((0x2401U >> (*pbVar1 & 0x1f) & 1) == 0);
    if (ctx->showAnnotatedSource == true) {
      iVar8 = (int)lVar10;
      iVar9 = (int)(pSVar3->pos).end;
      if (((pcVar2 != ctx->lastStart) || (-ctx->lastStartOffset != iVar8)) ||
         ((iVar9 - ctx->lastEndOffset) + iVar7 != iVar8)) {
        uVar12 = (iVar7 + iVar9) - iVar8;
        Print(ctx,"// %.*s");
        OutputContext::Print(ctx->output,"\n",1);
        PrintIndent(ctx);
        local_50 = (uint)uVar13;
        if ((((instruction->super_VmValue).source)->pos).end < pcVar15) {
          Print(ctx,"// ");
          if (iVar8 != 0) {
            uVar16 = 0;
            do {
              Print(ctx," ");
              if (pcVar11[lVar10 + uVar16] == '\t') {
                pcVar15 = "   ";
                if (uVar16 == 0) {
                  pcVar15 = "  ";
                }
                Print(ctx,pcVar15);
              }
              uVar16 = uVar16 + 1;
            } while ((uVar13 & 0xffffffff) != uVar16);
          }
          if (local_50 < uVar12) {
            lVar17 = 0;
            do {
              Print(ctx,"~");
              if (pcVar11[lVar10 + lVar17 + uVar18] == '\t') {
                pcVar15 = "~~~";
                if (-(uVar13 & 0xffffffff) == lVar17) {
                  pcVar15 = "~~";
                }
                Print(ctx,pcVar15);
              }
              lVar17 = lVar17 + 1;
            } while (iVar9 - (int)pcVar11 != (int)lVar17);
          }
          OutputContext::Print(ctx->output,"\n",1);
          PrintIndent(ctx);
        }
        ctx->lastStart = pcVar2;
        ctx->lastStartOffset = local_50;
        ctx->lastEndOffset = uVar12;
      }
    }
    else if (pcVar2 != ctx->lastStart) {
      Print(ctx,"// %.*s");
      OutputContext::Print(ctx->output,"\n",1);
      PrintIndent(ctx);
      ctx->lastStart = pcVar2;
    }
  }
  PrintUsers(ctx,&instruction->super_VmValue,false);
  if (((instruction->super_VmValue).type.type != VM_TYPE_VOID) ||
     ((instruction->super_VmValue).type.size != 0)) {
    if (ctx->showTypes == true) {
      PrintType(ctx,(instruction->super_VmValue).type);
      Print(ctx," ");
    }
    Print(ctx,"%%%d",(ulong)instruction->uniqueId);
    if (instruction->color != 0) {
      Print(ctx,".c%d");
    }
    if ((instruction->regVmRegisters).count != 0) {
      Print(ctx,".r");
      if ((instruction->regVmRegisters).count != 0) {
        uVar18 = 0;
        do {
          pcVar11 = "|%d";
          if (uVar18 == 0) {
            pcVar11 = "%d";
          }
          Print(ctx,pcVar11,(ulong)(instruction->regVmRegisters).data[uVar18]);
          uVar18 = uVar18 + 1;
        } while (uVar18 < (instruction->regVmRegisters).count);
      }
    }
    if ((ctx->showComments == true) &&
       (pcVar11 = (instruction->super_VmValue).comment.begin,
       pcVar11 != (instruction->super_VmValue).comment.end)) {
      Print(ctx," (%.*s)",
            (ulong)(uint)(*(int *)&(instruction->super_VmValue).comment.end - (int)pcVar11));
    }
    if (ctx->showFullTypes == true) {
      pTVar4 = (instruction->super_VmValue).type.structType;
      if (pTVar4 == (TypeBase *)0x0) {
        Print(ctx," <");
        PrintType(ctx,(instruction->super_VmValue).type);
        Print(ctx,">");
      }
      else {
        Print(ctx," <%.*s>",(ulong)(uint)(*(int *)&(pTVar4->name).end - (int)(pTVar4->name).begin));
      }
    }
    Print(ctx," = ");
  }
  pcVar11 = GetInstructionName(instruction);
  Print(ctx,"%s",pcVar11);
  if (instruction->cmd == VM_INST_PHI) {
    Print(ctx," [");
    uVar12 = (instruction->arguments).count;
    if (uVar12 != 0) {
      uVar14 = 0;
      do {
        if (uVar12 <= uVar14 + 1) {
          __assert_fail("index < count",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x199,
                        "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]"
                       );
        }
        ppVVar5 = (instruction->arguments).data;
        pVVar6 = ppVVar5[uVar14];
        value = ppVVar5[uVar14 + 1];
        if (uVar14 != 0) {
          Print(ctx,", ");
        }
        PrintName(ctx,pVVar6,false,false);
        Print(ctx," from ");
        PrintName(ctx,value,false,false);
        uVar14 = uVar14 + 2;
        uVar12 = (instruction->arguments).count;
      } while (uVar14 < uVar12);
    }
    Print(ctx,"]");
  }
  else {
    if (ctx->displayAsTree != false) {
      if (((instruction->super_VmValue).type.type == VM_TYPE_VOID) &&
         ((instruction->super_VmValue).type.size == 0)) {
        Print(ctx," // %%%d",(ulong)instruction->uniqueId);
      }
      OutputContext::Print(ctx->output,"\n",1);
      ctx->depth = ctx->depth + 1;
      if ((instruction->arguments).count != 0) {
        uVar18 = 0;
        do {
          value_00 = (VmInstruction *)(instruction->arguments).data[uVar18];
          PrintIndent(ctx);
          if ((value_00 == (VmInstruction *)0x0) ||
             (instruction_00 = value_00, (value_00->super_VmValue).typeID != 2)) {
            instruction_00 = (VmInstruction *)0x0;
          }
          if ((instruction_00 == (VmInstruction *)0x0) ||
             ((instruction_00->super_VmValue).users.count == 0)) {
            PrintName(ctx,(VmValue *)value_00,false,false);
            OutputContext::Print(ctx->output,"\n",1);
          }
          else {
            PrintInstruction(ctx,instruction_00);
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 < (instruction->arguments).count);
      }
      ctx->depth = ctx->depth - 1;
      return;
    }
    if ((instruction->arguments).count != 0) {
      uVar18 = 0;
      do {
        pVVar6 = (instruction->arguments).data[uVar18];
        pcVar11 = ", ";
        if (uVar18 == 0) {
          pcVar11 = " ";
        }
        Print(ctx,pcVar11);
        PrintName(ctx,pVVar6,false,false);
        uVar18 = uVar18 + 1;
      } while (uVar18 < (instruction->arguments).count);
    }
    if (((instruction->super_VmValue).type.type == VM_TYPE_VOID) &&
       ((instruction->super_VmValue).type.size == 0)) {
      Print(ctx," // %%%d",(ulong)instruction->uniqueId);
    }
  }
  OutputContext::Print(ctx->output,"\n",1);
  return;
}

Assistant:

void PrintInstruction(InstructionVMGraphContext &ctx, VmInstruction *instruction)
{
	if(ctx.showSource && instruction->source && !instruction->source->isInternal)
	{
		const char *start = instruction->source->pos.begin;
		const char *end = start + 1;

		// TODO: handle source locations from imported modules
		while(start > ctx.code && *(start - 1) != '\r' && *(start - 1) != '\n')
			start--;

		while(*end && *end != '\r' && *end != '\n')
			end++;

		if (ctx.showAnnotatedSource)
		{
			unsigned startOffset = unsigned(instruction->source->pos.begin - start);
			unsigned endOffset = unsigned(instruction->source->pos.end - start);

			if(start != ctx.lastStart || startOffset != ctx.lastStartOffset || endOffset != ctx.lastEndOffset)
			{
				Print(ctx, "// %.*s", unsigned(end - start), start);
				PrintLine(ctx);
				PrintIndent(ctx);

				if (instruction->source->pos.end < end)
				{
					Print(ctx, "// ");

					for (unsigned i = 0; i < startOffset; i++)
					{
						Print(ctx, " ");

						if (start[i] == '\t')
							Print(ctx, i == 0 ? "  " : "   ");
					}

					for (unsigned i = startOffset; i < endOffset; i++)
					{
						Print(ctx, "~");

						if (start[i] == '\t')
							Print(ctx, i == 0 ? "~~" : "~~~");
					}

					PrintLine(ctx);
					PrintIndent(ctx);
				}

				ctx.lastStart = start;
				ctx.lastStartOffset = startOffset;
				ctx.lastEndOffset = endOffset;
			}
		}
		else
		{
			if(start != ctx.lastStart)
			{
				Print(ctx, "// %.*s", unsigned(end - start), start);
				PrintLine(ctx);
				PrintIndent(ctx);

				ctx.lastStart = start;
			}
		}
	}

	PrintUsers(ctx, instruction, false);

	if(instruction->type != VmType::Void)
	{
		if(ctx.showTypes)
		{
			PrintType(ctx, instruction->type);
			Print(ctx, " ");
		}

		Print(ctx, "%%%d", instruction->uniqueId);

		if(instruction->color)
			Print(ctx, ".c%d", instruction->color);

		if(!instruction->regVmRegisters.empty())
		{
			Print(ctx, ".r");

			for(unsigned i = 0; i < instruction->regVmRegisters.size(); i++)
				Print(ctx, i == 0 ? "%d" : "|%d", instruction->regVmRegisters[i]);
		}

		if(ctx.showComments && !instruction->comment.empty())
			Print(ctx, " (%.*s)", FMT_ISTR(instruction->comment));

		if (ctx.showFullTypes)
		{
			if (instruction->type.structType)
			{
				Print(ctx, " <%.*s>", FMT_ISTR(instruction->type.structType->name));
			}
			else
			{
				Print(ctx, " <");
				PrintType(ctx, instruction->type);
				Print(ctx, ">");
			}
		}

		Print(ctx, " = ");
	}

	Print(ctx, "%s", GetInstructionName(instruction));

	if(instruction->cmd == VM_INST_PHI)
	{
		Print(ctx, " [");

		for(unsigned i = 0; i < instruction->arguments.size(); i += 2)
		{
			VmValue *value = instruction->arguments[i];
			VmValue *edge = instruction->arguments[i + 1];

			if(i != 0)
				Print(ctx, ", ");

			PrintName(ctx, value, false, false);
			Print(ctx, " from ");
			PrintName(ctx, edge, false, false);
		}

		Print(ctx, "]");
		PrintLine(ctx);

		return;
	}

	if(ctx.displayAsTree)
	{
		if(instruction->type == VmType::Void)
			Print(ctx, " // %%%d", instruction->uniqueId);

		PrintLine(ctx);

		ctx.depth++;

		for(unsigned i = 0; i < instruction->arguments.size(); i++)
		{
			VmValue *value = instruction->arguments[i];

			PrintIndent(ctx);

			VmInstruction *inst = getType<VmInstruction>(value);

			if(inst && !inst->users.empty())
			{
				PrintInstruction(ctx, inst);
			}
			else
			{
				PrintName(ctx, value, false, false);
				PrintLine(ctx);
			}
		}

		ctx.depth--;
	}
	else
	{
		for(unsigned i = 0; i < instruction->arguments.size(); i++)
		{
			VmValue *value = instruction->arguments[i];

			if(i == 0)
				Print(ctx, " ");
			else
				Print(ctx, ", ");

			PrintName(ctx, value, false, false);
		}

		if(instruction->type == VmType::Void)
			Print(ctx, " // %%%d", instruction->uniqueId);

		PrintLine(ctx);
	}
}